

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringWTF16Get
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StringWTF16Get *curr)

{
  bool bVar1;
  int32_t init;
  Literal *pLVar2;
  element_type *peVar3;
  ulong uVar4;
  size_t sVar5;
  Literal local_110;
  uint local_f4;
  SmallVector<wasm::Literal,_1UL> *pSStack_f0;
  Index i;
  Literals *values;
  shared_ptr<wasm::GCData> data;
  Literal refValue;
  Flow pos;
  undefined1 local_68 [8];
  Flow ref;
  StringWTF16Get *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,curr->ref);
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    visit((Flow *)&refValue.type,this,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18))
    ;
    bVar1 = Flow::breaking((Flow *)&refValue.type);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&refValue.type);
    }
    else {
      pLVar2 = Flow::getSingleValue((Flow *)local_68);
      wasm::Literal::Literal
                ((Literal *)
                 &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 pLVar2);
      wasm::Literal::getGCData((Literal *)&values);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&values);
      if (!bVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&values);
      pSStack_f0 = &(peVar3->values).super_SmallVector<wasm::Literal,_1UL>;
      pLVar2 = Flow::getSingleValue((Flow *)&refValue.type);
      local_f4 = wasm::Literal::geti32(pLVar2);
      uVar4 = (ulong)local_f4;
      sVar5 = SmallVector<wasm::Literal,_1UL>::size(pSStack_f0);
      if (sVar5 <= uVar4) {
        (*this->_vptr_ExpressionRunner[2])(this,"string oob");
      }
      pLVar2 = SmallVector<wasm::Literal,_1UL>::operator[](pSStack_f0,(ulong)local_f4);
      init = wasm::Literal::geti32(pLVar2);
      wasm::Literal::Literal(&local_110,init);
      Flow::Flow(__return_storage_ptr__,&local_110);
      wasm::Literal::~Literal(&local_110);
      std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&values);
      wasm::Literal::~Literal
                ((Literal *)
                 &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    Flow::~Flow((Flow *)&refValue.type);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringWTF16Get(StringWTF16Get* curr) {
    NOTE_ENTER("StringWTF16Get");
    Flow ref = visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow pos = visit(curr->pos);
    if (pos.breaking()) {
      return pos;
    }
    auto refValue = ref.getSingleValue();
    auto data = refValue.getGCData();
    if (!data) {
      trap("null ref");
    }
    auto& values = data->values;
    Index i = pos.getSingleValue().geti32();
    if (i >= values.size()) {
      trap("string oob");
    }

    return Literal(values[i].geti32());
  }